

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

void PrintMapType(FLispString *out,ZCC_TreeNode *node)

{
  FLispString::Open(out,"map-type");
  PrintNodes(out,node[1].SiblingNext,true,false);
  PrintNodes(out,node[1].SiblingPrev,true,false);
  PrintNodes(out,(ZCC_TreeNode *)node[1].SourceName,true,false);
  FLispString::Close(out);
  return;
}

Assistant:

static void PrintMapType(FLispString &out, ZCC_TreeNode *node)
{
	ZCC_MapType *tnode = (ZCC_MapType *)node;
	out.Open("map-type");
	PrintNodes(out, tnode->ArraySize);
	PrintNodes(out, tnode->KeyType);
	PrintNodes(out, tnode->ValueType);
	out.Close();
}